

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

void __thiscall
duckdb::LocalSortState::ReOrder
          (LocalSortState *this,SortedData *sd,data_ptr_t sorting_ptr,RowDataCollection *heap,
          GlobalSortState *gstate,bool reorder_heap)

{
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *this_00;
  BufferManager *pBVar1;
  size_t size;
  pointer puVar2;
  LocalSortState *pLVar3;
  RowDataCollection *pRVar4;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
  *this_01;
  int iVar5;
  reference pvVar6;
  pointer pRVar7;
  data_ptr_t pdVar8;
  pointer pRVar9;
  data_ptr_t pdVar10;
  BlockHandle *pBVar11;
  undefined4 extraout_var;
  char *pcVar12;
  pointer this_02;
  undefined3 in_register_00000089;
  idx_t iVar13;
  idx_t iVar14;
  ulong uVar15;
  bool bVar16;
  templated_unique_single_t ordered_heap_block;
  templated_unique_single_t ordered_data_block;
  BufferHandle ordered_data_handle;
  BufferHandle ordered_heap_handle;
  idx_t heap_block_size;
  BufferHandle unordered_data_handle;
  MemoryTag local_d1;
  idx_t local_d0;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> local_c8;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> local_c0;
  SortedData *local_b8;
  LocalSortState *local_b0;
  undefined4 local_a4;
  RowLayout *local_a0;
  RowDataCollection *local_98;
  BufferHandle local_90;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
  *local_78;
  GlobalSortState *local_70;
  BufferHandle local_68;
  ulong local_50;
  BufferHandle local_48;
  
  local_a4 = CONCAT31(in_register_00000089,reorder_heap);
  sd->swizzled = reorder_heap;
  local_78 = (vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
              *)&sd->data_blocks;
  local_b8 = sd;
  local_98 = heap;
  local_70 = gstate;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   *)local_78);
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar6);
  local_d0 = pRVar7->count;
  pBVar1 = this->buffer_manager;
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar6);
  (*pBVar1->_vptr_BufferManager[7])(&local_48,pBVar1,pRVar7);
  pdVar8 = BufferHandle::Ptr(&local_48);
  local_90.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = 4;
  pBVar1 = this->buffer_manager;
  local_b0 = this;
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar6);
  pRVar9 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar6);
  make_uniq<duckdb::RowDataBlock,duckdb::MemoryTag,duckdb::BufferManager&,unsigned_long&,unsigned_long_const&>
            ((duckdb *)&local_c0,(MemoryTag *)&local_90,pBVar1,&pRVar7->capacity,&pRVar9->entry_size
            );
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                       *)&local_c0);
  pRVar7->count = local_d0;
  pBVar1 = local_b0->buffer_manager;
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                       *)&local_c0);
  (*pBVar1->_vptr_BufferManager[7])(&local_90,pBVar1,pRVar7);
  pdVar10 = BufferHandle::Ptr(&local_90);
  local_a0 = &local_b8->layout;
  size = (local_b8->layout).row_width;
  iVar14 = (local_70->sort_layout).entry_size;
  iVar13 = local_d0;
  while (bVar16 = iVar13 != 0, iVar13 = iVar13 - 1, bVar16) {
    FastMemcpy(pdVar10,pdVar8 + *(uint *)sorting_ptr * size,size);
    pdVar10 = pdVar10 + size;
    sorting_ptr = (data_ptr_t)((long)sorting_ptr + iVar14);
  }
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                       *)&local_c0);
  this_01 = local_78;
  pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar7->block);
  pcVar12 = "LocalSortState::ReOrder.ordered_data";
  if ((local_b8->swizzled & 1U) == 0) {
    pcVar12 = (char *)0x0;
  }
  if ((local_b8->layout).all_constant != false) {
    pcVar12 = (char *)0x0;
  }
  pBVar11->unswizzled = pcVar12;
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ::clear((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           *)this_01);
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
            (this_01,(unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      *)&local_c0);
  if (((char)local_a4 != '\0') && ((local_b8->layout).all_constant == false)) {
    pdVar8 = BufferHandle::Ptr(&local_90);
    RowOperations::SwizzleColumns(local_a0,pdVar8,local_d0);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                     *)this_01);
    pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar6);
    pBVar11 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar7->block);
    pBVar11->unswizzled = (char *)0x0;
    this_00 = &local_98->blocks;
    puVar2 = (local_98->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar15 = 0;
    for (this_02 = (local_98->blocks).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pLVar3 = local_b0, this_02 != puVar2;
        this_02 = this_02 + 1) {
      pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(this_02);
      uVar15 = uVar15 + pRVar7->byte_offset;
    }
    iVar5 = (*local_b0->buffer_manager->_vptr_BufferManager[0xf])();
    local_50 = CONCAT44(extraout_var,iVar5);
    if (CONCAT44(extraout_var,iVar5) < uVar15) {
      local_50 = uVar15;
    }
    local_d1 = ORDER_BY;
    local_68.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = 1;
    make_uniq<duckdb::RowDataBlock,duckdb::MemoryTag,duckdb::BufferManager&,unsigned_long&,unsigned_int>
              ((duckdb *)&local_c8,&local_d1,pLVar3->buffer_manager,&local_50,(uint *)&local_68);
    pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                         *)&local_c8);
    pRVar7->count = local_d0;
    pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                         *)&local_c8);
    pRVar7->byte_offset = uVar15;
    pBVar1 = local_b0->buffer_manager;
    pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                         *)&local_c8);
    (*pBVar1->_vptr_BufferManager[7])(&local_68,pBVar1,pRVar7);
    pdVar8 = BufferHandle::Ptr(&local_68);
    pdVar10 = BufferHandle::Ptr(&local_90);
    pdVar10 = pdVar10 + (local_b8->layout).heap_pointer_offset;
    iVar14 = local_d0;
    while (bVar16 = iVar14 != 0, iVar14 = iVar14 - 1, bVar16) {
      uVar15 = (ulong)**(uint **)pdVar10;
      switchD_016b0717::default(pdVar8,*(uint **)pdVar10,uVar15);
      pdVar8 = pdVar8 + uVar15;
      pdVar10 = pdVar10 + size;
    }
    pdVar8 = BufferHandle::Ptr(&local_90);
    pdVar10 = BufferHandle::Ptr(&local_68);
    RowOperations::SwizzleHeapPointer(local_a0,pdVar8,pdVar10,local_d0,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
              ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                *)&local_b8->heap_blocks,
               (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *)
               &local_c8);
    pRVar4 = local_98;
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::clear
              (&(local_98->pinned_blocks).
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::clear(&this_00->
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           );
    pRVar4->count = 0;
    BufferHandle::~BufferHandle(&local_68);
    ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::~unique_ptr
              (&local_c8);
  }
  BufferHandle::~BufferHandle(&local_90);
  ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::~unique_ptr
            (&local_c0);
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void LocalSortState::ReOrder(SortedData &sd, data_ptr_t sorting_ptr, RowDataCollection &heap, GlobalSortState &gstate,
                             bool reorder_heap) {
	sd.swizzled = reorder_heap;
	auto &unordered_data_block = sd.data_blocks.back();
	const idx_t count = unordered_data_block->count;
	auto unordered_data_handle = buffer_manager->Pin(unordered_data_block->block);
	const data_ptr_t unordered_data_ptr = unordered_data_handle.Ptr();
	// Create new block that will hold re-ordered row data
	auto ordered_data_block = make_uniq<RowDataBlock>(MemoryTag::ORDER_BY, *buffer_manager,
	                                                  unordered_data_block->capacity, unordered_data_block->entry_size);
	ordered_data_block->count = count;
	auto ordered_data_handle = buffer_manager->Pin(ordered_data_block->block);
	data_ptr_t ordered_data_ptr = ordered_data_handle.Ptr();
	// Re-order fixed-size row layout
	const idx_t row_width = sd.layout.GetRowWidth();
	const idx_t sorting_entry_size = gstate.sort_layout.entry_size;
	for (idx_t i = 0; i < count; i++) {
		auto index = Load<uint32_t>(sorting_ptr);
		FastMemcpy(ordered_data_ptr, unordered_data_ptr + index * row_width, row_width);
		ordered_data_ptr += row_width;
		sorting_ptr += sorting_entry_size;
	}
	ordered_data_block->block->SetSwizzling(
	    sd.layout.AllConstant() || !sd.swizzled ? nullptr : "LocalSortState::ReOrder.ordered_data");
	// Replace the unordered data block with the re-ordered data block
	sd.data_blocks.clear();
	sd.data_blocks.push_back(std::move(ordered_data_block));
	// Deal with the heap (if necessary)
	if (!sd.layout.AllConstant() && reorder_heap) {
		// Swizzle the column pointers to offsets
		RowOperations::SwizzleColumns(sd.layout, ordered_data_handle.Ptr(), count);
		sd.data_blocks.back()->block->SetSwizzling(nullptr);
		// Create a single heap block to store the ordered heap
		idx_t total_byte_offset =
		    std::accumulate(heap.blocks.begin(), heap.blocks.end(), (idx_t)0,
		                    [](idx_t a, const unique_ptr<RowDataBlock> &b) { return a + b->byte_offset; });
		idx_t heap_block_size = MaxValue(total_byte_offset, buffer_manager->GetBlockSize());
		auto ordered_heap_block = make_uniq<RowDataBlock>(MemoryTag::ORDER_BY, *buffer_manager, heap_block_size, 1U);
		ordered_heap_block->count = count;
		ordered_heap_block->byte_offset = total_byte_offset;
		auto ordered_heap_handle = buffer_manager->Pin(ordered_heap_block->block);
		data_ptr_t ordered_heap_ptr = ordered_heap_handle.Ptr();
		// Fill the heap in order
		ordered_data_ptr = ordered_data_handle.Ptr();
		const idx_t heap_pointer_offset = sd.layout.GetHeapOffset();
		for (idx_t i = 0; i < count; i++) {
			auto heap_row_ptr = Load<data_ptr_t>(ordered_data_ptr + heap_pointer_offset);
			auto heap_row_size = Load<uint32_t>(heap_row_ptr);
			memcpy(ordered_heap_ptr, heap_row_ptr, heap_row_size);
			ordered_heap_ptr += heap_row_size;
			ordered_data_ptr += row_width;
		}
		// Swizzle the base pointer to the offset of each row in the heap
		RowOperations::SwizzleHeapPointer(sd.layout, ordered_data_handle.Ptr(), ordered_heap_handle.Ptr(), count);
		// Move the re-ordered heap to the SortedData, and clear the local heap
		sd.heap_blocks.push_back(std::move(ordered_heap_block));
		heap.pinned_blocks.clear();
		heap.blocks.clear();
		heap.count = 0;
	}
}